

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

Edge * __thiscall Plan::FindWork(Plan *this)

{
  bool bVar1;
  reference ppEVar2;
  Edge *edge;
  iterator e;
  Plan *this_local;
  
  e._M_node = (_Base_ptr)this;
  bVar1 = more_ready(this);
  if (bVar1) {
    edge = (Edge *)std::set<Edge_*,_EdgeCmp,_std::allocator<Edge_*>_>::begin(&this->ready_);
    ppEVar2 = std::_Rb_tree_const_iterator<Edge_*>::operator*
                        ((_Rb_tree_const_iterator<Edge_*> *)&edge);
    this_local = (Plan *)*ppEVar2;
    std::set<Edge*,EdgeCmp,std::allocator<Edge*>>::erase_abi_cxx11_
              ((set<Edge*,EdgeCmp,std::allocator<Edge*>> *)&this->ready_,(const_iterator)edge);
  }
  else {
    this_local = (Plan *)0x0;
  }
  return (Edge *)this_local;
}

Assistant:

Edge* Plan::FindWork() {
  if (!more_ready())
    return NULL;
  EdgeSet::iterator e = ready_.begin();
  Edge* edge = *e;
  ready_.erase(e);
  return edge;
}